

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O0

void gost_dec_cfb(gost_ctx *ctx,byte *iv,byte *cipher,byte *clear,int blocks)

{
  byte bVar1;
  byte *in_RCX;
  byte *in_RDX;
  undefined8 *in_RSI;
  int in_R8D;
  byte *out;
  byte *in;
  int j;
  int i;
  byte gamma [8];
  byte cur_iv [8];
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38;
  byte local_34 [8];
  undefined8 local_2c;
  int local_24;
  
  local_2c = *in_RSI;
  local_24 = in_R8D;
  for (local_38 = 0; local_38 < local_24; local_38 = local_38 + 1) {
    gostcrypt((gost_ctx *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDX,
              in_RCX);
    for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < 8;
        in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
      bVar1 = in_RDX[in_stack_ffffffffffffffc4];
      *(byte *)((long)&local_2c + (long)in_stack_ffffffffffffffc4) = bVar1;
      in_RCX[in_stack_ffffffffffffffc4] = bVar1 ^ local_34[in_stack_ffffffffffffffc4];
    }
    in_RDX = in_RDX + 8;
    in_RCX = in_RCX + 8;
  }
  return;
}

Assistant:

void gost_dec_cfb(gost_ctx * ctx, const byte * iv, const byte * cipher,
                  byte * clear, int blocks)
{
    byte cur_iv[8];
    byte gamma[8];
    int i, j;
    const byte *in;
    byte *out;
    memcpy(cur_iv, iv, 8);
    for (i = 0, in = cipher, out = clear; i < blocks; i++, in += 8, out += 8) {
        gostcrypt(ctx, cur_iv, gamma);
        for (j = 0; j < 8; j++) {
            out[j] = (cur_iv[j] = in[j]) ^ gamma[j];
        }
    }
}